

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  Object *pOVar2;
  Object *pOVar3;
  Array *pAVar4;
  exception *e;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  Array local_460;
  allocator<char> local_439;
  string local_438;
  Array local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  Object local_3a8;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  Object local_320;
  undefined1 local_2e8 [8];
  Json json1;
  Json js;
  istream local_218 [8];
  ifstream file;
  
  std::ifstream::ifstream(local_218,"../test.json",_S_in);
  json::Json::Json((Json *)&json1.array.fields.
                            super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_218);
  json::Json::Json((Json *)local_2e8);
  poVar1 = json::operator<<((ostream *)&std::cout,
                            (Json *)&json1.array.fields.
                                     super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  json::Object::Object(&local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"Test String",&local_341);
  pOVar2 = json::Object::operator()(&local_320,&local_340,"string");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"Test object",&local_369);
  json::Object::Object(&local_3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"Foo",&local_3c9);
  pOVar3 = json::Object::operator()(&local_3a8,&local_3c8,0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"Bar",&local_3f1);
  json::Array::Array(&local_418);
  pAVar4 = json::Array::operator()(&local_418,0x234);
  pAVar4 = json::Array::operator()(pAVar4,"Test");
  pOVar3 = json::Object::operator()(pOVar3,&local_3f0,pAVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"Quuz",&local_439);
  json::Array::Array(&local_460);
  pAVar4 = json::Array::operator()(&local_460,0x2a);
  pAVar4 = json::Array::operator()(pAVar4,false);
  pOVar3 = json::Object::operator()(pOVar3,&local_438,pAVar4);
  pOVar2 = json::Object::operator()(pOVar2,&local_368,pOVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"Test Integer",&local_481)
  ;
  pOVar2 = json::Object::operator()(pOVar2,&local_480,0x2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"Test Float",&local_4a9);
  pOVar2 = json::Object::operator()(pOVar2,&local_4a8,3.1415);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"Test Bool",(allocator<char> *)((long)&e + 7));
  pOVar2 = json::Object::operator()(pOVar2,&local_4d0,false);
  poVar1 = json::operator<<((ostream *)&std::cout,pOVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  json::Array::~Array(&local_460);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  json::Array::~Array(&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  json::Object::~Object(&local_3a8);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  json::Object::~Object(&local_320);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  json::Json::~Json((Json *)local_2e8);
  json::Json::~Json((Json *)&json1.array.fields.
                             super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(local_218);
  return 0;
}

Assistant:

int main() {
    try {

        // Сделать ещё парсер yaml

        std::ifstream file("../test.json");
        json::Json js(file);
        json::Json json1;
        std::cout << js << std::endl;

        std::cout << json::Object()
                ("Test String", "string")
                ("Test object", json::Object()
                        ("Foo", 32)
                        ("Bar", json::Array()
                                (564)
                                ("Test")
                        )
                        ("Quuz", json::Array()
                                (42)
                                (false)
                        )
                )
                ("Test Integer", 42)
                ("Test Float", 3.1415)
                ("Test Bool", false) << std::endl;

        std::cout << std::endl;
   	}
    catch (std::exception const& e) {
        std::cerr << e.what() << std::endl;
    }
}